

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O3

void google::protobuf::compiler::objectivec::anon_unknown_0::
     CollectMinimalFileDepsContainingExtensionsWorker
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *files,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *files_visited)

{
  _Rb_tree_header *p_Var1;
  pointer *pppFVar2;
  iterator __position;
  bool bVar3;
  _Base_ptr p_Var4;
  FileDescriptor *pFVar5;
  _Base_ptr p_Var6;
  int iVar7;
  FileDescriptor *local_28;
  
  p_Var4 = (files_visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(files_visited->_M_t)._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(FileDescriptor **)(p_Var4 + 1) >= file) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(FileDescriptor **)(p_Var4 + 1) < file];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(FileDescriptor **)(p_Var6 + 1) <= file)) {
      return;
    }
  }
  local_28 = file;
  std::
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
            ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)files_visited,&local_28);
  pFVar5 = local_28;
  bVar3 = FileContainsExtensions(local_28);
  if (bVar3) {
    __position._M_current =
         (files->
         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
                  *)files,__position,&local_28);
    }
    else {
      *__position._M_current = pFVar5;
      pppFVar2 = &(files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar2 = *pppFVar2 + 1;
    }
    if (0 < *(int *)(local_28 + 0x20)) {
      iVar7 = 0;
      do {
        pFVar5 = FileDescriptor::dependency(local_28,iVar7);
        PruneFileAndDepsMarkingAsVisited(pFVar5,files,files_visited);
        iVar7 = iVar7 + 1;
      } while (iVar7 < *(int *)(local_28 + 0x20));
    }
  }
  else if (0 < *(int *)(pFVar5 + 0x20)) {
    iVar7 = 0;
    do {
      pFVar5 = FileDescriptor::dependency(pFVar5,iVar7);
      CollectMinimalFileDepsContainingExtensionsWorker(pFVar5,files,files_visited);
      iVar7 = iVar7 + 1;
      pFVar5 = local_28;
    } while (iVar7 < *(int *)(local_28 + 0x20));
  }
  return;
}

Assistant:

void CollectMinimalFileDepsContainingExtensionsWorker(
    const FileDescriptor* file,
    std::vector<const FileDescriptor*>* files,
    std::set<const FileDescriptor*>* files_visited) {
  if (files_visited->find(file) != files_visited->end()) {
    return;
  }
  files_visited->insert(file);

  if (FileContainsExtensions(file)) {
    files->push_back(file);
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      PruneFileAndDepsMarkingAsVisited(dep, files, files_visited);
    }
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      CollectMinimalFileDepsContainingExtensionsWorker(dep, files,
                                                       files_visited);
    }
  }
}